

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::iterate(FunctionalTest *this)

{
  PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE p_Var1;
  PFNGLCOPYNAMEDBUFFERSUBDATA p_Var2;
  PFNGLMAPNAMEDBUFFER p_Var3;
  PFNGLMAPNAMEDBUFFERRANGE p_Var4;
  PFNGLNAMEDBUFFERDATA p_Var5;
  PFNGLNAMEDBUFFERSTORAGE p_Var6;
  PFNGLNAMEDBUFFERSUBDATA p_Var7;
  PFNGLUNMAPNAMEDBUFFER p_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  int iVar22;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar24;
  undefined4 uVar25;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar23;
  
  iVar22 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar22);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar20 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar21 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access"
                     );
  if ((!bVar20) && (!bVar21)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    goto LAB_00af308a;
  }
  iVar22 = *(int *)(lVar23 + 0x1d8);
  iVar9 = *(int *)(lVar23 + 0x1dc);
  iVar10 = *(int *)(lVar23 + 0x1e0);
  iVar11 = *(int *)(lVar23 + 0x1e4);
  p_Var1 = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar23 + 0x660);
  p_Var2 = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar23 + 0x340);
  *(int *)&this->m_pClearNamedBufferData = iVar22;
  *(int *)((long)&this->m_pClearNamedBufferData + 4) = iVar9;
  *(int *)&this->m_pClearNamedBufferSubData = iVar10;
  *(int *)((long)&this->m_pClearNamedBufferSubData + 4) = iVar11;
  this->m_pCopyNamedBufferSubData = p_Var2;
  this->m_pFlushMappedNamedBufferRange = p_Var1;
  iVar12 = *(int *)(lVar23 + 0x8f0);
  iVar13 = *(int *)(lVar23 + 0x8f4);
  iVar14 = *(int *)(lVar23 + 0x8f8);
  iVar15 = *(int *)(lVar23 + 0x8fc);
  *(int *)&this->m_pGetNamedBufferParameteri64v = iVar12;
  *(int *)((long)&this->m_pGetNamedBufferParameteri64v + 4) = iVar13;
  *(int *)&this->m_pGetNamedBufferParameteriv = iVar14;
  *(int *)((long)&this->m_pGetNamedBufferParameteriv + 4) = iVar15;
  iVar16 = *(int *)(lVar23 + 0x900);
  iVar17 = *(int *)(lVar23 + 0x904);
  iVar18 = *(int *)(lVar23 + 0x908);
  iVar19 = *(int *)(lVar23 + 0x90c);
  *(int *)&this->m_pGetNamedBufferPointerv = iVar16;
  *(int *)((long)&this->m_pGetNamedBufferPointerv + 4) = iVar17;
  *(int *)&this->m_pGetNamedBufferSubData = iVar18;
  *(int *)((long)&this->m_pGetNamedBufferSubData + 4) = iVar19;
  p_Var3 = *(PFNGLMAPNAMEDBUFFER *)(lVar23 + 0xd08);
  this->m_pMapNamedBuffer = p_Var3;
  p_Var4 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar23 + 0xd10);
  this->m_pMapNamedBufferRange = p_Var4;
  p_Var5 = *(PFNGLNAMEDBUFFERDATA *)(lVar23 + 0xec0);
  this->m_pNamedBufferData = p_Var5;
  p_Var6 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar23 + 0xed8);
  this->m_pNamedBufferStorage = p_Var6;
  p_Var7 = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar23 + 0xee0);
  this->m_pNamedBufferSubData = p_Var7;
  p_Var8 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar23 + 0x1678);
  this->m_pUnmapNamedBuffer = p_Var8;
  auVar31._0_4_ = -(uint)(iVar22 == 0);
  auVar31._4_4_ = -(uint)(iVar9 == 0);
  auVar31._8_4_ = -(uint)(iVar10 == 0);
  auVar31._12_4_ = -(uint)(iVar11 == 0);
  auVar33._4_4_ = auVar31._0_4_;
  auVar33._0_4_ = auVar31._4_4_;
  auVar33._8_4_ = auVar31._12_4_;
  auVar33._12_4_ = auVar31._8_4_;
  auVar34._0_4_ = -(uint)((int)p_Var2 == 0);
  auVar34._4_4_ = -(uint)((int)((ulong)p_Var2 >> 0x20) == 0);
  auVar34._8_4_ = -(uint)((int)p_Var1 == 0);
  auVar34._12_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0);
  auVar32._4_4_ = auVar34._0_4_;
  auVar32._0_4_ = auVar34._4_4_;
  auVar32._8_4_ = auVar34._12_4_;
  auVar32._12_4_ = auVar34._8_4_;
  auVar34 = packssdw(auVar33 & auVar31,auVar32 & auVar34);
  auVar26._0_4_ = -(uint)(iVar12 == 0);
  auVar26._4_4_ = -(uint)(iVar13 == 0);
  auVar26._8_4_ = -(uint)(iVar14 == 0);
  auVar26._12_4_ = -(uint)(iVar15 == 0);
  auVar29._4_4_ = auVar26._0_4_;
  auVar29._0_4_ = auVar26._4_4_;
  auVar29._8_4_ = auVar26._12_4_;
  auVar29._12_4_ = auVar26._8_4_;
  auVar30._0_4_ = -(uint)(iVar16 == 0);
  auVar30._4_4_ = -(uint)(iVar17 == 0);
  auVar30._8_4_ = -(uint)(iVar18 == 0);
  auVar30._12_4_ = -(uint)(iVar19 == 0);
  auVar27._4_4_ = auVar30._0_4_;
  auVar27._0_4_ = auVar30._4_4_;
  auVar27._8_4_ = auVar30._12_4_;
  auVar27._12_4_ = auVar30._8_4_;
  auVar30 = packssdw(auVar29 & auVar26,auVar27 & auVar30);
  auVar30 = packssdw(auVar34,auVar30);
  if (((((((((auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0')
     || (((auVar28._0_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0),
          auVar28._4_4_ = -(uint)((int)p_Var4 == 0 && (int)((ulong)p_Var4 >> 0x20) == 0),
          auVar28._8_4_ = -(uint)((int)((ulong)p_Var5 >> 0x20) == 0 && (int)p_Var5 == 0),
          auVar28._12_4_ = -(uint)((int)p_Var6 == 0 && (int)((ulong)p_Var6 >> 0x20) == 0),
          uVar25 = movmskps((int)p_Var3,auVar28), (char)uVar25 != '\0' ||
          (p_Var7 == (PFNGLNAMEDBUFFERSUBDATA)0x0)) || (p_Var8 == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
    puVar24 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar24 = 0;
    __cxa_throw(puVar24,&int::typeinfo,0);
  }
  BuildProgram(this);
  PrepareVertexArrayObject(this);
  bVar20 = PrepareInputBuffer(this);
  if ((bVar20) && (bVar20 = PrepareOutputBuffer(this), bVar20)) {
    Draw(this);
    bVar20 = CheckArrayBufferImmutableFlag(this);
    if ((!bVar20) || (bVar20 = CheckTransformFeedbackBufferSize(this), !bVar20)) goto LAB_00af3060;
    bVar20 = CheckTransformFeedbackResult(this);
  }
  else {
LAB_00af3060:
    bVar20 = false;
  }
  Cleanup(this);
  do {
    iVar22 = (**(code **)(lVar23 + 0x800))();
  } while (iVar22 != 0);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (bVar20 == false) {
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  else {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
LAB_00af308a:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test. */
		BuildProgram();
		PrepareVertexArrayObject();

		is_ok = is_ok && PrepareInputBuffer();
		is_ok = is_ok && PrepareOutputBuffer();

		if (is_ok)
		{
			Draw();
		}

		is_ok = is_ok && CheckArrayBufferImmutableFlag();
		is_ok = is_ok && CheckTransformFeedbackBufferSize();
		is_ok = is_ok && CheckTransformFeedbackResult();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean Up. */
	Cleanup();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}